

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFontCache::clear(QFontCache *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  QFontEngineData **ppQVar5;
  Engine *pEVar6;
  int *piVar7;
  long in_RDI;
  long in_FS_OFFSET;
  int cacheCount;
  bool mightHaveEnginesLeftForCleanup;
  int i;
  QFontEngineData *data;
  QFontEngine *engine;
  Iterator end_1;
  Iterator it_1;
  Iterator end;
  Iterator it;
  iterator *in_stack_ffffffffffffff88;
  QFontEngine *in_stack_ffffffffffffff90;
  QFontEngine *this_00;
  QFontEngineData *in_stack_ffffffffffffff98;
  QFontEngineData *pQVar8;
  QFontEngineData *in_stack_ffffffffffffffa0;
  int local_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QFontDef,_QFontEngineData_*>::begin
            ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_ffffffffffffffa0);
  QMap<QFontDef,_QFontEngineData_*>::end
            ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_ffffffffffffffa0);
  while (bVar2 = ::operator!=((iterator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88),
        bVar2) {
    ppQVar5 = QMap<QFontDef,_QFontEngineData_*>::iterator::value((iterator *)0x717b90);
    pQVar8 = *ppQVar5;
    for (local_44 = 0; local_44 < 0xac; local_44 = local_44 + 1) {
      if (pQVar8->engines[local_44] != (QFontEngine *)0x0) {
        bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x717bd4);
        if ((!bVar2) &&
           (in_stack_ffffffffffffffa0 = (QFontEngineData *)pQVar8->engines[local_44],
           in_stack_ffffffffffffffa0 != (QFontEngineData *)0x0)) {
          (**(code **)(*(long *)in_stack_ffffffffffffffa0 + 8))();
        }
        pQVar8->engines[local_44] = (QFontEngine *)0x0;
      }
    }
    bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x717c2e);
    if ((!bVar2) && (in_stack_ffffffffffffff98 = pQVar8, pQVar8 != (QFontEngineData *)0x0)) {
      QFontEngineData::~QFontEngineData(in_stack_ffffffffffffffa0);
      operator_delete(pQVar8,0x568);
      in_stack_ffffffffffffff98 = pQVar8;
    }
    QMap<QFontDef,_QFontEngineData_*>::iterator::operator++((iterator *)in_stack_ffffffffffffff90);
  }
  QMap<QFontDef,_QFontEngineData_*>::clear
            ((QMap<QFontDef,_QFontEngineData_*> *)in_stack_ffffffffffffff90);
  do {
    bVar2 = false;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin
              ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_ffffffffffffffa0);
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::end
              ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_ffffffffffffffa0);
    while (bVar3 = ::operator!=((iterator *)in_stack_ffffffffffffff90,
                                (iterator *)in_stack_ffffffffffffff88), bVar3) {
      pEVar6 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value((iterator *)0x717ce6)
      ;
      this_00 = pEVar6->data;
      if (this_00 != (QFontEngine *)0x0) {
        piVar7 = QHash<QFontEngine_*,_int>::operator[]
                           ((QHash<QFontEngine_*,_int> *)in_stack_ffffffffffffffa0,
                            (QFontEngine **)in_stack_ffffffffffffff98);
        *piVar7 = *piVar7 + -1;
        bVar3 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x717d29);
        if (!bVar3) {
          TVar4 = QFontEngine::type(this_00);
          bVar2 = TVar4 == Multi;
          in_stack_ffffffffffffff90 = this_00;
          if (this_00 != (QFontEngine *)0x0) {
            (*this_00->_vptr_QFontEngine[1])();
            in_stack_ffffffffffffff90 = this_00;
          }
        }
        pEVar6 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::value
                           ((iterator *)0x717d75);
        pEVar6->data = (QFontEngine *)0x0;
      }
      QMultiMap<QFontCache::Key,_QFontCache::Engine>::iterator::operator++
                ((iterator *)in_stack_ffffffffffffff90);
    }
  } while (bVar2);
  QMultiMap<QFontCache::Key,_QFontCache::Engine>::clear
            ((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_ffffffffffffff90);
  QHash<QFontEngine_*,_int>::clear((QHash<QFontEngine_*,_int> *)in_stack_ffffffffffffff90);
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0x1000;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::clear()
{
    {
        EngineDataCache::Iterator it = engineDataCache.begin(),
                                 end = engineDataCache.end();
        while (it != end) {
            QFontEngineData *data = it.value();
            for (int i = 0; i < QFontDatabasePrivate::ScriptCount; ++i) {
                if (data->engines[i]) {
                    if (!data->engines[i]->ref.deref()) {
                        Q_ASSERT(engineCacheCount.value(data->engines[i]) == 0);
                        delete data->engines[i];
                    }
                    data->engines[i] = nullptr;
                }
            }
            if (!data->ref.deref()) {
                delete data;
            } else {
                FC_DEBUG("QFontCache::clear: engineData %p still has refcount %d",
                         data, data->ref.loadRelaxed());
            }
            ++it;
        }
    }

    engineDataCache.clear();


    bool mightHaveEnginesLeftForCleanup;
    do {
        mightHaveEnginesLeftForCleanup = false;
        for (EngineCache::Iterator it = engineCache.begin(), end = engineCache.end();
             it != end; ++it) {
            QFontEngine *engine = it.value().data;
            if (engine) {
                const int cacheCount = --engineCacheCount[engine];
                Q_ASSERT(cacheCount >= 0);
                if (!engine->ref.deref()) {
                    Q_ASSERT(cacheCount == 0);
                    mightHaveEnginesLeftForCleanup = engine->type() == QFontEngine::Multi;
                    delete engine;
                } else if (cacheCount == 0) {
                    FC_DEBUG("QFontCache::clear: engine %p still has refcount %d",
                             engine, engine->ref.loadRelaxed());
                }
                it.value().data = nullptr;
            }
        }
    } while (mightHaveEnginesLeftForCleanup);

    engineCache.clear();
    engineCacheCount.clear();


    total_cost = 0;
    max_cost = min_cost;
}